

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_reflect_vec2(ShaderEvalContext *c)

{
  ulong uVar1;
  int i;
  long lVar2;
  float res;
  float fVar3;
  float local_28 [2];
  Vector<float,_2> res_1;
  float local_18 [2];
  Vector<float,_2> res_2;
  ulong local_8;
  
  local_28[0] = c->in[0].m_data[3];
  local_28[1] = c->in[0].m_data[1];
  uVar1 = *(ulong *)c->in[1].m_data;
  local_8 = uVar1 << 0x20 | uVar1 >> 0x20;
  fVar3 = 0.0;
  lVar2 = 0;
  do {
    fVar3 = fVar3 + *(float *)((long)&local_8 + lVar2 * 4) * local_28[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    res_1.m_data[lVar2] = *(float *)((long)&local_8 + lVar2 * 4) * (fVar3 + fVar3);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    res_2.m_data[lVar2] = local_28[lVar2] - res_1.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  res_1.m_data = (float  [2])&c->color;
  local_18[0] = 1.4013e-45;
  local_18[1] = 2.8026e-45;
  lVar2 = 0;
  do {
    (c->color).m_data[(int)(&res_2)[-1].m_data[lVar2]] = res_2.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }